

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O2

InterpretDFDResult
interpretDFD(uint32_t *DFD,InterpretedDFDChannel *R,InterpretedDFDChannel *G,
            InterpretedDFDChannel *B,InterpretedDFDChannel *A,uint32_t *wordBytes)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint32_t uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  InterpretedDFDChannel *pIVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint32_t uVar19;
  InterpretDFDResult local_6c;
  InterpretDFDResult local_58;
  
  uVar11 = (DFD[2] >> 0x12) - 6;
  if (3 < uVar11) {
    R->offset = 0;
    R->size = 0;
    G->offset = 0;
    G->size = 0;
    B->offset = 0;
    B->size = 0;
    A->offset = 0;
    A->size = 0;
    if (0xff < DFD[5]) {
      return i_UNSUPPORTED_MULTIPLE_PLANES;
    }
    if (DFD[6] != 0) {
      return i_UNSUPPORTED_MULTIPLE_PLANES;
    }
    uVar11 = uVar11 >> 2;
    lVar9 = (ulong)uVar11 * 0x10;
    lVar8 = lVar9 + 0x10;
    lVar6 = 0;
    do {
      if (lVar8 == lVar6 + 0x10) {
        local_58 = i_LITTLE_ENDIAN_FORMAT_BIT;
        goto LAB_001e7c34;
      }
      uVar5 = *(uint *)((long)DFD + lVar6 + 0x1c);
    } while (((uVar5 & 7) == 0) && (lVar6 = lVar6 + 0x10, ((uVar5 >> 0x10) + 1 & 7) == 0));
    local_58 = i_PACKED_FORMAT_BIT;
LAB_001e7c34:
    uVar5 = DFD[3];
    uVar17 = 0;
    uVar10 = 0;
    bVar13 = 0;
    uVar16 = 0;
    uVar12 = 0;
    while( true ) {
      if (uVar11 << 2 == uVar17) break;
      uVar18 = DFD[uVar17 + 7];
      if ((int)uVar18 < 0) {
        bVar7 = (float)DFD[(ulong)((int)uVar17 + 9U & 0xfffffffd) + 1] != 1.0;
        uVar14 = 0;
      }
      else {
        uVar1 = DFD[(ulong)((int)uVar17 + 9U & 0xfffffffd) + 1];
        bVar7 = uVar1 < (((uVar18 & 0x40000000) == 0) + 1 << ((byte)(uVar18 >> 0x10) & 0x1f)) - 1 &&
                1 < uVar1;
        uVar14 = (uint)bVar7;
        bVar7 = (bool)(~bVar7 & uVar1 != 1);
      }
      uVar12 = uVar12 | (uVar18 & 0x40000000) >> 0x1e;
      uVar10 = uVar10 | uVar14;
      uVar16 = uVar16 | uVar18 >> 0x1f;
      bVar13 = bVar13 | (uVar18 & 0xff0000) != 0 & bVar7;
      uVar17 = uVar17 + 4;
    }
    local_6c = uVar10 * 0x20 + (uint)bVar13 * 8 | uVar16 << 6 | uVar12 << 4 | local_58;
    if ((uVar5 & 0xff) == 2) {
      local_6c = local_6c | (i_YUVSDA_FORMAT_BIT|i_COMPRESSED_FORMAT_BIT|i_NORMALIZED_FORMAT_BIT);
      bVar7 = false;
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 0x10) {
        uVar11 = *(byte *)((long)DFD + lVar6 + 0x1f) & 0xf;
        if (0xf < uVar11) {
          return i_UNSUPPORTED_CHANNEL_TYPES;
        }
        if ((0x8007U >> uVar11 & 1) == 0) {
          if ((0x6000U >> uVar11 & 1) == 0) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
          bVar7 = true;
        }
      }
      uVar11 = 0;
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 0x10) {
        bVar13 = *(byte *)((long)DFD + lVar6 + 0x1e);
        if (uVar11 <= bVar13) {
          uVar11 = bVar13 + 1;
        }
      }
      uVar4 = bit_ceil(uVar11);
      *wordBytes = (uVar4 << (sbyte)local_58) >> 3;
    }
    else {
      if ((uVar5 & 0xff) != 1) {
        return i_UNSUPPORTED_CHANNEL_TYPES;
      }
      if ((uVar5 & 0xff0000) == 0x20000) {
        local_6c = local_6c | i_SRGB_FORMAT_BIT;
      }
      lVar6 = 0;
      while (lVar8 != lVar6 + 0x10) {
        lVar3 = lVar6 + 0x20;
        lVar6 = lVar6 + 0x10;
        if (*(int *)((long)DFD + lVar3) != 0) {
          return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
      }
      bVar7 = false;
    }
    uVar5 = uVar5 & 0xff;
    if (uVar5 - 1 < 2) {
      for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 0x10) {
        bVar7 = (bool)(bVar7 | (*(byte *)((long)DFD + lVar6 + 0x1f) & 0xf) - 0xd < 2);
      }
      if (!bVar7) {
        lVar6 = 0;
        while (lVar8 != lVar6 + 0x10) {
          uVar11 = *(uint *)((long)DFD + lVar6 + 0x1c);
          if (SUB41(uVar12,0) == ((uVar11 >> 0x1e & 1) == 0)) {
            return i_UNSUPPORTED_MIXED_CHANNELS;
          }
          lVar6 = lVar6 + 0x10;
          if (-1 < (int)uVar11 == SUB41(uVar16,0)) {
            return i_UNSUPPORTED_MIXED_CHANNELS;
          }
        }
      }
      if ((local_6c & i_PACKED_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT) {
        uVar11 = 0xffffffff;
        bVar2 = false;
        uVar10 = 0;
        uVar12 = 0;
        for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 0x10) {
          uVar16 = *(uint *)((long)DFD + lVar8 + 0x1c);
          uVar18 = uVar16 >> 0x18 & 0xf;
          pIVar15 = R;
          if ((((uVar18 != 0) && (pIVar15 = A, uVar18 != 0xf)) && (pIVar15 = B, uVar18 != 2)) &&
             (((pIVar15 = G, uVar18 != 0xd && (pIVar15 = R, uVar18 != 0xe)) &&
              (pIVar15 = G, uVar18 != 1)))) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
          uVar14 = uVar16 >> 3 & 0x1fff;
          uVar16 = (uVar16 >> 0x10 & 0xff) + 1 >> 3;
          if (uVar18 == uVar11) {
            if (uVar14 == uVar10 - 1) {
              if ((bVar2) && ((local_6c & i_BIG_ENDIAN_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT)) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              local_6c = local_6c | i_BIG_ENDIAN_FORMAT_BIT;
              pIVar15->offset = uVar14;
            }
            else {
              if (uVar14 != uVar12 + uVar10) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              if ((bVar2) && ((local_6c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT)) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
            }
            uVar4 = pIVar15->size + uVar16;
            pIVar15->size = uVar4;
            bVar2 = true;
          }
          else {
            if (pIVar15->size != 0) {
              if (uVar5 != 2) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              if (uVar18 != 0) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              if ((pIVar15 == R) && (pIVar15 = A, A->size != 0)) {
                return i_UNSUPPORTED_CHANNEL_TYPES;
              }
            }
            pIVar15->offset = uVar14;
            pIVar15->size = uVar16;
            uVar4 = uVar16;
            uVar11 = uVar18;
          }
          *wordBytes = uVar4;
          uVar10 = uVar14;
          uVar12 = uVar16;
        }
      }
      else {
        *wordBytes = (uint)(byte)DFD[5];
        uVar11 = 0xffffffff;
        uVar10 = 0;
        uVar12 = 0;
        uVar4 = 0;
        for (lVar8 = 0; lVar9 != lVar8; lVar8 = lVar8 + 0x10) {
          uVar16 = *(uint *)((long)DFD + lVar8 + 0x1c);
          uVar18 = uVar16 >> 0x18 & 0xf;
          pIVar15 = R;
          if (((((uVar18 != 0) && (pIVar15 = A, uVar18 != 0xf)) && (pIVar15 = B, uVar18 != 2)) &&
              ((pIVar15 = G, uVar18 != 0xd && (pIVar15 = R, uVar18 != 0xe)))) &&
             (pIVar15 = G, uVar18 != 1)) {
            return i_UNSUPPORTED_CHANNEL_TYPES;
          }
          uVar14 = uVar16 & 0xffff;
          uVar19 = (uVar16 >> 0x10 & 0xff) + 1;
          if (uVar18 == uVar11) {
            if (uVar14 >> 3 != uVar10 - 1) {
              return i_UNSUPPORTED_ERROR_BIT;
            }
            if (((uVar16 | uVar4 + uVar12) & 7) != 0) {
              return i_UNSUPPORTED_ERROR_BIT;
            }
            local_6c = local_6c | i_BIG_ENDIAN_FORMAT_BIT;
            pIVar15->size = pIVar15->size + uVar19;
          }
          else {
            if (pIVar15->size != 0) {
              if (uVar5 != 2) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              if (uVar18 != 0) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              if ((pIVar15 == R) && (pIVar15 = A, A->size != 0)) {
                return i_UNSUPPORTED_CHANNEL_TYPES;
              }
            }
            pIVar15->offset = uVar14;
            pIVar15->size = uVar19;
            uVar11 = uVar18;
          }
          uVar10 = uVar14 >> 3;
          uVar12 = uVar14;
          uVar4 = uVar19;
        }
        if ((local_6c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT) {
          uVar11 = *wordBytes * 8 - 8;
          R->offset = R->offset ^ uVar11;
          G->offset = G->offset ^ uVar11;
          B->offset = B->offset ^ uVar11;
          A->offset = A->offset ^ uVar11;
        }
      }
      if (bVar7) {
        uVar11 = G->size;
        if (G->size < R->size) {
          uVar11 = R->size;
        }
        uVar4 = bit_ceil(uVar11);
        *wordBytes = uVar4;
        return local_6c;
      }
      return local_6c;
    }
  }
  return i_UNSUPPORTED_CHANNEL_TYPES;
}

Assistant:

enum InterpretDFDResult interpretDFD(const uint32_t *DFD,
                                     InterpretedDFDChannel *R,
                                     InterpretedDFDChannel *G,
                                     InterpretedDFDChannel *B,
                                     InterpretedDFDChannel *A,
                                     uint32_t *wordBytes)
{
    /* DFD points to the whole descriptor, not the basic descriptor block. */
    /* Make everything else relative to the basic descriptor block. */
    const uint32_t *BDFDB = DFD+1;

    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    if (numSamples == 0)
        return i_UNSUPPORTED_CHANNEL_TYPES;

    int determinedEndianness = 0;
    enum InterpretDFDResult result = 0; /* Build this up incrementally. */

    bool isDepthStencil = false;

    /* Clear these so following code doesn't get confused. */
    R->offset = R->size = 0;
    G->offset = G->size = 0;
    B->offset = B->size = 0;
    A->offset = A->size = 0;

    /* First rule out the multiple planes case (trivially) */
    /* - that is, we check that only bytesPlane0 is non-zero. */
    /* This means we don't handle multi-plane YUV, even if the API could. */
    /* (We rely on KHR_DF_WORD_BYTESPLANE0..3 being the same and */
    /* KHR_DF_WORD_BYTESPLANE4..7 being the same as a short cut.) */
    if ((BDFDB[KHR_DF_WORD_BYTESPLANE0] & ~KHR_DF_MASK_BYTESPLANE0)
        || BDFDB[KHR_DF_WORD_BYTESPLANE4]) return i_UNSUPPORTED_MULTIPLE_PLANES;

    /* If this is a packed format, we work out our offsets differently. */
    /* We assume a packed format has channels that aren't byte-aligned. */
    /* If we have a format in which every channel is byte-aligned *and* packed, */
    /* we have the RGBA/ABGR ambiguity; we *probably* don't want the packed */
    /* version in this case, and if hardware has to pack it and swizzle, */
    /* that's up to the hardware to special-case. */
    for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
        uint32_t offset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
        uint32_t length = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
        if ((offset & 0x7U) || ((offset + length) & 0x7U)) {
            result |= i_PACKED_FORMAT_BIT;
            /* Once we're packed, we're packed, no need to keep checking. */
            break;
        }
    }

    // Check data types.
    bool hasSigned = false;
    bool hasFloat = false;
    bool hasNormalized = false;
    bool hasFixed = false;
    khr_df_model_e model = KHR_DFDVAL(BDFDB, MODEL);

    // Note: We're ignoring 9995, which is weird and worth special-casing
    // rather than trying to generalise to all float formats.
    for (uint32_t i = 0; i < numSamples; ++i) {
        const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

        // We define "unnormalized" as "sample_upper = 1" or "sample_upper = 1.0f".
        // We don't check whether any non-1 normalization value is correct
        // (i.e. set to the maximum bit value, and check min value) on
        // the assumption that we're looking at a format which *came* from
        // an API we can support.
        bool isFixed;
        bool isNormalized;
        if (isFloat) {
            isNormalized = *(float*) (void*) &BDFDB[KHR_DF_WORD_SAMPLESTART +
                    KHR_DF_WORD_SAMPLEWORDS * i +
                    KHR_DF_SAMPLEWORD_SAMPLEUPPER] != 1.0f;
            isFixed = false;
        } else {
            uint32_t sampleUpper = KHR_DFDSVAL(BDFDB, i, SAMPLEUPPER);
            uint32_t maxVal = 1U << KHR_DFDSVAL(BDFDB, i, BITLENGTH);
            if (!isSigned) maxVal <<= 1;
            maxVal--;
            isFixed = 1U < sampleUpper && sampleUpper < maxVal;
            isNormalized = !isFixed && sampleUpper != 1U;
        }
        hasSigned |= isSigned;
        hasFixed |= isFixed;
        hasFloat |= isFloat;
        // By our definition the normalizedness of a single bit channel (like in RGBA 5:5:5:1)
        // is ambiguous. Ignore these during normalized checks.
        if (KHR_DFDSVAL(BDFDB, i, BITLENGTH) > 0)
            hasNormalized |= isNormalized;
    }
    result |= hasSigned ? i_SIGNED_FORMAT_BIT : 0;
    result |= hasFloat ? i_FLOAT_FORMAT_BIT : 0;
    result |= hasNormalized ? i_NORMALIZED_FORMAT_BIT : 0;
    result |= hasFixed ? i_FIXED_FORMAT_BIT : 0;

    // Checks based on color model
    if (model == KHR_DF_MODEL_YUVSDA) {
        result |= i_NORMALIZED_FORMAT_BIT;
        result |= i_COMPRESSED_FORMAT_BIT;
        result |= i_YUVSDA_FORMAT_BIT;

        for (uint32_t i = 0; i < numSamples; ++i) {
            switch (KHR_DFDSVAL(BDFDB, i, CHANNELID)) {
            case KHR_DF_CHANNEL_YUVSDA_Y:
            case KHR_DF_CHANNEL_YUVSDA_U:
            case KHR_DF_CHANNEL_YUVSDA_V:
            case KHR_DF_CHANNEL_YUVSDA_A:
                break;
            case KHR_DF_CHANNEL_YUVSDA_DEPTH:
            case KHR_DF_CHANNEL_YUVSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                return i_UNSUPPORTED_CHANNEL_TYPES;
            }
        }

        // Determine wordBytes
        uint32_t largestSampleSize = 0;
        for (uint32_t i = 0; i < numSamples; ++i) {
            uint32_t length = KHR_DFDSVAL(BDFDB, i, BITLENGTH) + 1;
            if (largestSampleSize < length)
                largestSampleSize = length;
        }
        *wordBytes = ((result & i_PACKED_FORMAT_BIT) ? 4 : 1) * bit_ceil(largestSampleSize) / 8;

    } else if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_RGBSDA) {
        /* Check if transfer is sRGB. */
        if (KHR_DFDVAL(BDFDB, TRANSFER) == KHR_DF_TRANSFER_SRGB) result |= i_SRGB_FORMAT_BIT;

        /* We only support samples at coordinate 0,0,0,0. */
        /* (We could confirm this from texel_block_dimensions in 1.2, but */
        /* the interpretation might change in later versions.) */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            if (KHR_DFDSVAL(BDFDB, sampleCounter, SAMPLEPOSITION_ALL))
                return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
    }

    if (model == KHR_DF_MODEL_RGBSDA || model == KHR_DF_MODEL_YUVSDA) {
        /* The values of the DEPTH and STENCIL tokens are the same for */
        /* RGBSDA and YUVSDA. */
        /* For Depth/Stencil formats mixed channels are allowed */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            switch (KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID)) {
            case KHR_DF_CHANNEL_RGBSDA_DEPTH:
            case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                break;
            }
        }

        // Check for mixed channels
        if (!isDepthStencil) {
            for (uint32_t i = 0; i < numSamples; ++i) {
                const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
                const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

                if (isSigned != hasSigned)
                    return i_UNSUPPORTED_MIXED_CHANNELS;
                if (isFloat != hasFloat)
                    return i_UNSUPPORTED_MIXED_CHANNELS;

                // Note: We don't check for inconsistent normalization, because
                // channels composed of multiple samples will have 0 in the
                // lower/upper range. Single bit channels are also ambiguous.
                // This heuristic should handle 64-bit integers, too.
            }
        }

        /* This all relies on the channel id values for RGB being equal to */
        /* those for YUV. */

        /* Remember: the canonical ordering of samples is to start with */
        /* the lowest bit of the channel/location which touches bit 0 of */
        /* the data, when the latter is concatenated in little-endian order, */
        /* and then progress until all the bits of that channel/location */
        /* have been processed. Multiple channels sharing the same source */
        /* bits are processed in channel ID order. (I should clarify this */
        /* for partially-shared data, but it doesn't really matter so long */
        /* as everything is consecutive, except to make things canonical.) */
        /* Note: For standard formats we could determine big/little-endianness */
        /* simply from whether the first sample starts in bit 0; technically */
        /* it's possible to have a format with unaligned channels wherein the */
        /* first channel starts at bit 0 and is one byte, yet other channels */
        /* take more bytes or aren't aligned (e.g. D24S8), but this should be */
        /* irrelevant for the formats that we support. */
        if ((result & i_PACKED_FORMAT_BIT)) {
            /* A packed format. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentBitOffset = 0;
            uint32_t currentByteOffset = 0;
            uint32_t currentBitLength = 0;
            *wordBytes = (BDFDB[KHR_DF_WORD_BYTESPLANE0] & 0xFFU);
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
                uint32_t sampleByteOffset = sampleBitOffset >> 3U;
                /* The sample bitLength field stores the bit length - 1. */
                uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Since a big (>32-bit) channel isn't "packed", */
                    /* this should only happen in big-endian, or if */
                    /* we have a wacky format that we won't support. */
                    if (sampleByteOffset == currentByteOffset - 1U && /* One byte earlier */
                        ((currentBitOffset + currentBitLength) & 7U) == 0 && /* Already at the end of a byte */
                        (sampleBitOffset & 7U) == 0) { /* Start at the beginning of the byte */
                        /* All is good, continue big-endian. */
                        /* N.B. We shouldn't be here if we decided we were little-endian, */
                        /* so we don't bother to check that disagreement. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    /* Accumulate the bit length. */
                    sampleChannelPtr->size += sampleBitLength;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the bit offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleBitOffset;
                    sampleChannelPtr->size = sampleBitLength;
                }
            }
            if ((result & i_BIG_ENDIAN_FORMAT_BIT)) {
                /* Our bit offsets to bit 0 of each channel are in little-endian terms. */
                /* We need to do a byte swap to work out where they should be. */
                /* We assume, for sanity, that byte sizes are a power of two for this. */
                uint32_t offsetMask = (*wordBytes - 1U) << 3U;
                R->offset ^= offsetMask;
                G->offset ^= offsetMask;
                B->offset ^= offsetMask;
                A->offset ^= offsetMask;
            }
        } else {
            /* Not a packed format. */
            /* Everything is byte-aligned. */
            /* Question is whether there multiple samples per channel. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentByteOffset = 0;
            uint32_t currentByteLength = 0;
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleByteOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET) >> 3U;
                uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1) >> 3U;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Either big-endian, or little-endian with a very large channel. */
                    if (sampleByteOffset == currentByteOffset - 1) { /* One byte earlier */
                        if (determinedEndianness && !(result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue big-endian. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                        /* Update the start */
                        sampleChannelPtr->offset = sampleByteOffset;
                    } else if (sampleByteOffset == currentByteOffset + currentByteLength) {
                        if (determinedEndianness && (result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue little-endian. */
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    /* Accumulate the byte length. */
                    sampleChannelPtr->size += sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleChannelPtr->size;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the byte offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleByteOffset;
                    sampleChannelPtr->size = sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleByteLength;
                }
            }
        }
    } else {
        return i_UNSUPPORTED_CHANNEL_TYPES;
    }

    if (isDepthStencil) {
        /* For Depth/Stencil formats wordBytes is determined by the required alignment of */
        /* the larger channel. */
        uint32_t largerSize = R->size > G->size ? R->size : G->size;
        *wordBytes = bit_ceil(largerSize);
    }

    return result;
}